

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O1

vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
* __thiscall
reed_solomn::poly_align
          (vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
           *__return_storage_ptr__,reed_solomn *this,vector<__int128,_std::allocator<__int128>_> *A,
          vector<__int128,_std::allocator<__int128>_> *b)

{
  iterator iVar1;
  int iVar2;
  int iVar3;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar3 = (int)((ulong)((long)(A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 4) -
          (int)((ulong)((long)(b->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(b->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 4);
  (__return_storage_ptr__->
  super__Vector_base<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar3 < 1) {
    if (iVar3 < 0) {
      iVar2 = 1;
      if (1 < -iVar3) {
        iVar2 = -iVar3;
      }
      do {
        local_48 = 0;
        uStack_40 = 0;
        iVar1._M_current =
             (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<__int128,_std::allocator<__int128>_>::_M_realloc_insert<__int128>
                    (A,iVar1,(__int128 *)&local_48);
        }
        else {
          *(undefined8 *)iVar1._M_current = 0;
          *(undefined8 *)((long)iVar1._M_current + 8) = 0;
          (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  }
  else {
    do {
      local_48 = 0;
      uStack_40 = 0;
      iVar1._M_current =
           (b->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (b->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<__int128,_std::allocator<__int128>_>::_M_realloc_insert<__int128>
                  (b,iVar1,(__int128 *)&local_48);
      }
      else {
        *(undefined8 *)iVar1._M_current = 0;
        *(undefined8 *)((long)iVar1._M_current + 8) = 0;
        (b->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.super__Vector_impl_data
        ._M_finish = iVar1._M_current + 1;
      }
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  ::push_back(__return_storage_ptr__,A);
  std::
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  ::push_back(__return_storage_ptr__,b);
  return __return_storage_ptr__;
}

Assistant:

vector<vector<ll128>> reed_solomn::poly_align(vector<ll128> A, vector<ll128> b) {
    int diff = A.size() - b.size();
    vector<vector<ll128>> res;
    if (diff > 0) {
        for (int i = 0; i < diff; ++i) {
            b.push_back(0);
        }
    } else {
        diff = -diff;
        for (int i = 0; i < diff; ++i) {
            A.push_back(0);
        }
    }
    res.push_back(A);
    res.push_back(b);
    return res;
}